

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  int iVar1;
  long in_FS_OFFSET;
  NameContext local_a0;
  SrcList local_68;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.pWinSelect = (Select *)0x0;
  local_a0.nRef = 0;
  local_a0.nNcErr = 0;
  local_a0.uNC.pEList = (ExprList *)0x0;
  local_a0.pNext = (NameContext *)0x0;
  local_68.nSrc = 0;
  local_68.nAlloc = 0;
  local_68.a[0].zName = (char *)0x0;
  local_68.a[0].zAlias = (char *)0x0;
  local_68.a[0].pSTab = (Table *)0x0;
  local_68.a[0].fg = (anon_struct_4_19_bb8b771d_for_fg)0x0;
  local_68.a[0].iCursor = 0;
  local_68.a[0].colUsed = 0;
  local_68.a[0].u1.zIndexedBy = (char *)0x0;
  local_68.a[0].u2.pIBIndex = (Index *)0x0;
  local_68.a[0].u3.pOn = (Expr *)0x0;
  local_68.a[0].u4.pSchema = (Schema *)0x0;
  if (pTab != (Table *)0x0) {
    local_68.nSrc = 1;
    local_68.nAlloc = 0;
    local_68.a[0].zName = pTab->zName;
    local_68.a[0].fg = (anon_struct_4_19_bb8b771d_for_fg)0x0;
    local_68.a[0].iCursor = -1;
    local_68.a[0].pSTab = pTab;
    if (pTab->pSchema != pParse->db->aDb[1].pSchema) {
      type = type | 0x40000;
    }
  }
  local_a0.pSrcList = &local_68;
  local_a0._40_8_ = (ulong)(uint)type | 0x10000;
  local_a0.pParse = pParse;
  iVar1 = sqlite3ResolveExprNames(&local_a0,pExpr);
  if (iVar1 == 0) {
    if (pList == (ExprList *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3ResolveExprListNames(&local_a0,pList);
    }
  }
  else {
    iVar1 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveSelfReference(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* The table being referenced, or NULL */
  int type,        /* NC_IsCheck, NC_PartIdx, NC_IdxExpr, NC_GenCol, or 0 */
  Expr *pExpr,     /* Expression to resolve.  May be NULL. */
  ExprList *pList  /* Expression list to resolve.  May be NULL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */
  int rc;

  assert( type==0 || pTab!=0 );
  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr
          || type==NC_GenCol || pTab==0 );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  if( pTab ){
    sSrc.nSrc = 1;
    sSrc.a[0].zName = pTab->zName;
    sSrc.a[0].pSTab = pTab;
    sSrc.a[0].iCursor = -1;
    if( pTab->pSchema!=pParse->db->aDb[1].pSchema ){
      /* Cause EP_FromDDL to be set on TK_FUNCTION nodes of non-TEMP
      ** schema elements */
      type |= NC_FromDDL;
    }
  }
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type | NC_IsDDL;
  if( (rc = sqlite3ResolveExprNames(&sNC, pExpr))!=SQLITE_OK ) return rc;
  if( pList ) rc = sqlite3ResolveExprListNames(&sNC, pList);
  return rc;
}